

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

vm_prop_id_t __thiscall CVmImageLoader::alloc_new_prop(CVmImageLoader *this)

{
  CVmObjPageEntry *pCVar1;
  int iVar2;
  vm_val_t val;
  vm_val_t idx_val;
  vm_val_t new_cont;
  undefined1 local_40 [8];
  vm_prop_id_t local_38;
  undefined4 local_30 [2];
  undefined4 local_28;
  undefined1 local_20 [16];
  
  pCVar1 = G_obj_table_X.pages_[G_predef_X.last_prop_obj >> 0xc] +
           (G_predef_X.last_prop_obj & 0xfff);
  local_30[0] = 7;
  local_28 = 1;
  iVar2 = (**(code **)(*(long *)&pCVar1->ptr_ + 0x138))(pCVar1,local_40);
  if (iVar2 != 0) {
    if (local_38 == 0xffff) {
      err_throw(0xcd);
    }
    local_38 = local_38 + 1;
    iVar2 = (**(code **)(*(long *)&pCVar1->ptr_ + 0x140))
                      (pCVar1,local_20,G_predef_X.last_prop_obj,local_30);
    if (iVar2 != 0) {
      return local_38;
    }
  }
  err_throw(0x7de);
}

Assistant:

vm_prop_id_t CVmImageLoader::alloc_new_prop(VMG0_)
{
    CVmObjVector *vec;
    vm_val_t idx_val;
    vm_val_t val;
    vm_val_t new_cont;

    /* get the LastPropObj vector */
    vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   get the element at index 1 - our last property value is always at
     *   the first element 
     */
    idx_val.set_int(1);

    /* get the value from the vector */
    vec->index_val(vmg_ &val, G_predef->last_prop_obj, &idx_val);

    /* if we've allocated every available property ID, throw an error */
    if (val.val.prop == 65535)
        err_throw(VMERR_OUT_OF_PROPIDS);

    /* allocate the new property ID by incrementing the last used ID */
    ++val.val.prop;

    /* 
     *   update the vector with the new value (this new property ID is now
     *   the last property ID in use) 
     */
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &val);

    /* return the new last ID */
    return val.val.prop;
}